

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandFactory
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer puVar1;
  _Base_ptr p_Var2;
  unsigned_long uVar3;
  pointer pPVar4;
  bool bVar5;
  bool singular;
  bool bVar6;
  const_iterator cVar7;
  MemberData *pMVar8;
  long lVar9;
  VulkanHppGenerator *pVVar10;
  char *__s;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_59a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_599;
  string *local_598;
  string noexceptString;
  string returnType;
  string className;
  string handleType;
  string dataType;
  string resultCheck;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  string returnVariable;
  string commandName;
  string vulkanType;
  string argumentList;
  string definitionTemplate;
  string returnStatements;
  string callSequence;
  string dataDeclarations;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  undefined1 local_2b8 [40];
  size_t local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  params = &commandData->params;
  pVVar10 = (VulkanHppGenerator *)
            &(commandData->params).
             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1]].type.type;
  local_598 = name;
  bVar5 = isHandleType(this,(string *)pVVar10);
  if (bVar5) {
LAB_001407a6:
    puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if ((lVar9 != 1) &&
       ((((lVar9 != 2 || ((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1)) ||
         (p_Var2 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
         (_Base_ptr)*puVar1 != p_Var2[1]._M_parent)) ||
        (puVar1[1] != *(unsigned_long *)(p_Var2 + 1))))) {
      __assert_fail("( returnParams.size() == 1 ) || ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) && ( returnParams[1] == vectorParams.begin()->first ) )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2442,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    determineVoidPointerParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_2b8,pVVar10,params);
    if (local_290 != 0) {
      __assert_fail("determineVoidPointerParams( commandData.params ).empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2443,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    pVVar10 = (VulkanHppGenerator *)local_2b8;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)pVVar10);
    bVar5 = determineEnumeration(pVVar10,vectorParams,returnParams);
    singular = (bool)((flavourFlags.m_mask & 4) >> 2);
    pVVar10 = this;
    determineSkippedParams
              (&skippedParams,this,params,initialSkipCount,vectorParams,returnParams,singular);
    if ((flavourFlags.m_mask & 4) == 0) {
      local_378._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_378._M_impl.super__Rb_tree_header._M_header;
      local_378._M_impl._0_8_ = 0;
      local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_378._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_378._M_impl.super__Rb_tree_header._M_header._M_right =
           local_378._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      determineSingularParams
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_378,pVVar10,
                 (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish[-1],vectorParams);
    }
    generateRAIIHandleCommandFactoryArgumentList_abi_cxx11_
              (&argumentList,this,params,&skippedParams,definition,singular);
    generateCommandName(&commandName,this,local_598,params,initialSkipCount,flavourFlags);
    handleType._M_dataplus._M_p = (pointer)&handleType.field_2;
    handleType._M_string_length = 0;
    handleType.field_2._M_local_buf[0] = '\0';
    if (((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) &&
       (p_Var2 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)&p_Var2[1]._M_right == '\x01')) {
      if (*(unsigned_long *)(p_Var2 + 1) !=
          (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1]) {
        __assert_fail("vectorParams.begin()->first == returnParams.back()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x244f,
                      "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                     );
      }
      pMVar8 = vectorMemberByStructure
                         (this,&(commandData->params).
                                super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].type.type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE",
                 (allocator<char> *)&className);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&returnType,"Vk",(allocator<char> *)&dataType);
      TypeInfo::compose((string *)local_2b8,&pMVar8->type,&noexceptString,&returnType);
    }
    else {
      uVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1];
      pPVar4 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE",
                 (allocator<char> *)&className);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&returnType,"Vk",(allocator<char> *)&dataType);
      TypeInfo::compose((string *)local_2b8,&pPVar4[uVar3].type,&noexceptString,&returnType);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&handleType,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&returnType);
    std::__cxx11::string::~string((string *)&noexceptString);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&noexceptString," *",(allocator<char> *)&returnType);
    stripPostfix((string *)local_2b8,&handleType,&noexceptString);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&handleType,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&noexceptString);
    __s = "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
    if (bVar5) {
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&noexceptString,__s,(allocator<char> *)local_2b8);
    std::__cxx11::string::string((string *)&returnType,&handleType);
    bVar6 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::contains(vectorParams,
                       (returnParams->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish + -1);
    if (((flavourFlags.m_mask & 4) == 0) && (bVar6)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&noexceptString,"");
      std::operator+(&className,"std::vector<",&handleType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     &className,">");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&returnType,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)&className);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&handleType,"s");
    }
    if (definition) {
      if (initialSkipCount == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&className,"Context",(allocator<char> *)local_2b8);
      }
      else {
        pPVar4 = (params->
                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2b8,"Vk",(allocator<char> *)&dataType);
        stripPrefix(&className,&pPVar4[initialSkipCount - 1].type.type,(string *)local_2b8);
        std::__cxx11::string::~string((string *)local_2b8);
      }
      local_2b8._24_8_ = local_2b8 + 8;
      local_2b8._0_8_ = (pointer)0x0;
      local_2b8._8_8_ = 0;
      local_2b8._16_8_ = (_Base_ptr)0x0;
      local_290 = 0;
      pVVar10 = this;
      local_2b8._32_8_ = local_2b8._24_8_;
      determineDataTypes_abi_cxx11_
                (&dataTypes,this,params,vectorParams,returnParams,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_2b8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_2b8);
      combineDataTypes(&dataType,pVVar10,vectorParams,returnParams,bVar5,&dataTypes,flavourFlags,
                       true);
      generateReturnVariable_abi_cxx11_
                (&returnVariable,this,commandData,returnParams,vectorParams,flavourFlags);
      vulkanType._M_dataplus._M_p = (pointer)&vulkanType.field_2;
      vulkanType._M_string_length = 0;
      vulkanType.field_2._M_local_buf[0] = '\0';
      cVar7 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::find(&vectorParams->_M_t,
                     (returnParams->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish + -1);
      if (((_Rb_tree_header *)cVar7._M_node == &(vectorParams->_M_t)._M_impl.super__Rb_tree_header)
         || (*(char *)&cVar7._M_node[1]._M_right != '\x01')) {
        pPVar4 = (params->
                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 )._M_impl.super__Vector_impl_data._M_start +
                 (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish[-1];
      }
      else {
        pMVar8 = vectorMemberByStructure
                           (this,&(params->
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [(returnParams->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1]].type.type);
        pPVar4 = (pointer)&pMVar8->type;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&vulkanType,&(pPVar4->type).type);
      local_2b8._0_8_ = (pointer)0x0;
      local_2b8._8_8_ = 0;
      local_2b8._16_8_ = (_Base_ptr)0x0;
      p_Var2 = (_Base_ptr)(local_2b8 + 8);
      local_290 = 0;
      local_2b8._24_8_ = p_Var2;
      local_2b8._32_8_ = p_Var2;
      generateDataDeclarations
                (&dataDeclarations,this,commandData,returnParams,vectorParams,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_2b8,flavourFlags,true,&dataTypes,&dataType,&returnType,&returnVariable);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_2b8);
      local_2b8._16_8_ = (_Base_ptr)0x0;
      local_2b8._0_8_ = (pointer)0x0;
      local_2b8._8_8_ = 0;
      local_290 = 0;
      resultCheck._M_dataplus._M_p = (pointer)0x0;
      resultCheck._M_string_length = 0;
      resultCheck.field_2._M_allocated_capacity = 0;
      local_2b8._24_8_ = p_Var2;
      local_2b8._32_8_ = p_Var2;
      generateCallSequence
                (&callSequence,this,local_598,commandData,returnParams,vectorParams,initialSkipCount
                 ,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  &local_378,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_2b8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&resultCheck,
                 flavourFlags,true,true);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&resultCheck);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_2b8);
      generateResultCheckExpected
                (&resultCheck,this,&commandData->successCodes,&className,&commandName);
      generateRAIIFactoryReturnStatements
                (&returnStatements,this,params,&commandData->successCodes,&vulkanType,bVar5,
                 &returnType,&returnVariable,singular);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&definitionTemplate,
                 "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${returnStatements}\n  }\n"
                 ,(allocator<char> *)local_2b8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2b8,(char (*) [13])"argumentList",&argumentList);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_278,(char (*) [13])"callSequence",&callSequence);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_238,(char (*) [10])"className",&className);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1f8,(char (*) [12])"commandName",&commandName);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1b8,(char (*) [17])"dataDeclarations",&dataDeclarations);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_178,(char (*) [9])"noexcept",&noexceptString);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_138,(char (*) [12])"resultCheck",&resultCheck);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_f8,(char (*) [17])"returnStatements",&returnStatements);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_b8,(char (*) [11])"returnType",&returnType);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_true>(&local_78,(char (*) [14])"vkCommandName",local_598);
      __l_00._M_len = 10;
      __l_00._M_array = (iterator)local_2b8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_318,__l_00,&local_599,&local_59a);
      replaceWithMap(__return_storage_ptr__,&definitionTemplate,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_318);
      lVar9 = 0x240;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2b8 + lVar9));
        lVar9 = lVar9 + -0x40;
      } while (lVar9 != -0x40);
      std::__cxx11::string::~string((string *)&definitionTemplate);
      std::__cxx11::string::~string((string *)&returnStatements);
      std::__cxx11::string::~string((string *)&resultCheck);
      std::__cxx11::string::~string((string *)&callSequence);
      std::__cxx11::string::~string((string *)&dataDeclarations);
      std::__cxx11::string::~string((string *)&vulkanType);
      std::__cxx11::string::~string((string *)&returnVariable);
      std::__cxx11::string::~string((string *)&dataType);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dataTypes);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&className,
                 "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};\n"
                 ,(allocator<char> *)local_2b8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2b8,(char (*) [13])"argumentList",&argumentList);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_278,(char (*) [12])"commandName",&commandName);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_238,(char (*) [9])"noexcept",&noexceptString);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1f8,(char (*) [11])"returnType",&returnType);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_true>(&local_1b8,(char (*) [14])"vkCommandName",local_598);
      __l._M_len = 5;
      __l._M_array = (iterator)local_2b8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_348,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&dataType,(allocator_type *)&returnVariable);
      replaceWithMap(__return_storage_ptr__,&className,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_348);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_348);
      lVar9 = 0x100;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2b8 + lVar9));
        lVar9 = lVar9 + -0x40;
      } while (lVar9 != -0x40);
    }
    std::__cxx11::string::~string((string *)&className);
    std::__cxx11::string::~string((string *)&returnType);
    std::__cxx11::string::~string((string *)&noexceptString);
    std::__cxx11::string::~string((string *)&handleType);
    std::__cxx11::string::~string((string *)&commandName);
    std::__cxx11::string::~string((string *)&argumentList);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_378);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&skippedParams._M_t);
    return __return_storage_ptr__;
  }
  bVar5 = std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::contains(vectorParams,
                     (returnParams->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish + -1);
  if ((bVar5) &&
     (cVar7 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::find(&vectorParams->_M_t,
                     (returnParams->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish + -1),
     *(char *)&cVar7._M_node[1]._M_right == '\x01')) {
    pMVar8 = vectorMemberByStructure
                       (this,&(params->
                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              )._M_impl.super__Vector_impl_data._M_start
                              [(returnParams->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish[-1]].type.type);
    pVVar10 = (VulkanHppGenerator *)&(pMVar8->type).type;
    bVar5 = isHandleType(this,(string *)pVVar10);
    if (bVar5) goto LAB_001407a6;
  }
  __assert_fail("isHandleType( commandData.params[returnParams.back()].type.type ) || ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure && isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x243f,
                "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandFactory( std::string const &                       name,
                                                                  CommandData const &                       commandData,
                                                                  size_t                                    initialSkipCount,
                                                                  std::vector<size_t> const &               returnParams,
                                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                                  bool                                      definition,
                                                                  CommandFlavourFlags                       flavourFlags ) const
{
  assert( isHandleType( commandData.params[returnParams.back()].type.type ) ||
          ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure &&
            isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) ) );
  assert( ( returnParams.size() == 1 ) ||
          ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) &&
            ( returnParams[1] == vectorParams.begin()->first ) ) );
  assert( determineVoidPointerParams( commandData.params ).empty() );

  const bool       enumerating    = determineEnumeration( vectorParams, returnParams );
  const bool       singular       = flavourFlags & CommandFlavourFlagBits::singular;
  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams.back(), vectorParams ) : std::set<size_t>();
  std::string      argumentList   = generateRAIIHandleCommandFactoryArgumentList( commandData.params, skippedParams, definition, singular );
  std::string      commandName    = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );

  std::string handleType;
  if ( ( vectorParams.size() == 1 ) && vectorParams.begin()->second.byStructure )
  {
    assert( vectorParams.begin()->first == returnParams.back() );
    handleType = vectorMemberByStructure( commandData.params.back().type.type ).type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  else
  {
    handleType = commandData.params[returnParams.back()].type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  handleType                 = stripPostfix( handleType, " *" );
  std::string noexceptString = enumerating ? "" : "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  std::string returnType     = handleType;
  if ( vectorParams.contains( returnParams.back() ) && !singular )
  {
    noexceptString = "";
    returnType     = "std::vector<" + handleType + ">";
    handleType += "s";
  }

  if ( definition )
  {
    std::string              className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::vector<std::string> dataTypes      = determineDataTypes( commandData.params, vectorParams, returnParams, {} );
    std::string              dataType       = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );
    std::string              returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string              vulkanType;
    auto                     vectorParamIt = vectorParams.find( returnParams.back() );
    if ( ( vectorParamIt != vectorParams.end() ) && vectorParamIt->second.byStructure )
    {
      vulkanType = vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type;
    }
    else
    {
      vulkanType = commandData.params[returnParams.back()].type.type;
    }

    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, {}, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string callSequence =
      generateCallSequence( name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, {}, {}, flavourFlags, true, true );
    std::string resultCheck = generateResultCheckExpected( commandData.successCodes, className, commandName );
    std::string returnStatements =
      generateRAIIFactoryReturnStatements( commandData.params, commandData.successCodes, vulkanType, enumerating, returnType, returnVariable, singular );

    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${returnStatements}
  }
)";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatements", returnStatements },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "commandName", commandName },
                             { "noexcept", noexceptString },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
}